

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval_env.cc
# Opt level: O0

bool Rule::IsReservedBinding(string *var)

{
  bool bVar1;
  bool local_11;
  string *var_local;
  
  bVar1 = std::operator==(var,"command");
  local_11 = true;
  if (!bVar1) {
    bVar1 = std::operator==(var,"depfile");
    local_11 = true;
    if (!bVar1) {
      bVar1 = std::operator==(var,"dyndep");
      local_11 = true;
      if (!bVar1) {
        bVar1 = std::operator==(var,"description");
        local_11 = true;
        if (!bVar1) {
          bVar1 = std::operator==(var,"deps");
          local_11 = true;
          if (!bVar1) {
            bVar1 = std::operator==(var,"generator");
            local_11 = true;
            if (!bVar1) {
              bVar1 = std::operator==(var,"pool");
              local_11 = true;
              if (!bVar1) {
                bVar1 = std::operator==(var,"restat");
                local_11 = true;
                if (!bVar1) {
                  bVar1 = std::operator==(var,"rspfile");
                  local_11 = true;
                  if (!bVar1) {
                    bVar1 = std::operator==(var,"rspfile_content");
                    local_11 = true;
                    if (!bVar1) {
                      local_11 = std::operator==(var,"msvc_deps_prefix");
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return local_11;
}

Assistant:

bool Rule::IsReservedBinding(const string& var) {
  return var == "command" ||
      var == "depfile" ||
      var == "dyndep" ||
      var == "description" ||
      var == "deps" ||
      var == "generator" ||
      var == "pool" ||
      var == "restat" ||
      var == "rspfile" ||
      var == "rspfile_content" ||
      var == "msvc_deps_prefix";
}